

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

int stbi__pic_test(stbi__context *s)

{
  stbi_uc sVar1;
  int iVar2;
  long lVar3;
  
  iVar2 = 0;
  lVar3 = 0;
  do {
    sVar1 = stbi__get8(s);
    if (sVar1 != anon_var_dwarf_2443[lVar3]) goto LAB_00109947;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 4);
  iVar2 = 0x54;
  do {
    stbi__get8(s);
    iVar2 = iVar2 + -1;
  } while (iVar2 != 0);
  iVar2 = 0;
  lVar3 = 0;
  do {
    sVar1 = stbi__get8(s);
    if (sVar1 != "PICT"[lVar3]) goto LAB_00109947;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 4);
  iVar2 = 1;
LAB_00109947:
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  return iVar2;
}

Assistant:

static int stbi__pic_test(stbi__context *s)
{
   int r = stbi__pic_test_core(s);
   stbi__rewind(s);
   return r;
}